

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O0

size_t vlenc_u64(uint64_t val,uchar *buf)

{
  undefined8 local_20;
  size_t nbytes;
  uchar *buf_local;
  uint64_t val_local;
  
  local_20 = 0;
  nbytes = (size_t)buf;
  for (buf_local = (uchar *)val; (uchar *)0x7f < buf_local;
      buf_local = (uchar *)((ulong)buf_local >> 7)) {
    *(byte *)nbytes = (byte)buf_local & 0x7f | 0x80;
    local_20 = local_20 + 1;
    nbytes = nbytes + 1;
  }
  *(byte *)nbytes = (byte)buf_local;
  return local_20 + 1;
}

Assistant:

inline size_t vlenc_u64(uint64_t val, unsigned char* buf)
{
    size_t nbytes = 0;

    while (val > 0x7F) {
        *buf++ = (val & 0x7F) | 0x80;
        val >>= 7;
        ++nbytes;
    }

    *buf++ = val;
    ++nbytes;

    return nbytes;
}